

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getBinaryPropertyExpr(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if ((iVar1 == 0x30) || (iVar1 == 0x31)) {
    return FollowedByPropertyExpr;
  }
  if ((iVar1 == 0x55) || (iVar1 == 0x56)) {
    return ImplicationPropertyExpr;
  }
  if (iVar1 == 99) {
    return AndPropertyExpr;
  }
  if (iVar1 == 0xb7) {
    return IffPropertyExpr;
  }
  if (iVar1 == 0xbc) {
    return ImpliesPropertyExpr;
  }
  if (iVar1 != 0x13f) {
    if (iVar1 == 0x10f) {
      return SUntilPropertyExpr;
    }
    if (iVar1 == 0x110) {
      return SUntilWithPropertyExpr;
    }
    if (iVar1 == 0x13e) {
      return UntilPropertyExpr;
    }
    if (iVar1 == 0xe6) {
      return OrPropertyExpr;
    }
    return Unknown;
  }
  return UntilWithPropertyExpr;
}

Assistant:

SyntaxKind SyntaxFacts::getBinaryPropertyExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::AndKeyword: return SyntaxKind::AndPropertyExpr;
        case TokenKind::OrKeyword: return SyntaxKind::OrPropertyExpr;
        case TokenKind::IffKeyword: return SyntaxKind::IffPropertyExpr;
        case TokenKind::UntilKeyword: return SyntaxKind::UntilPropertyExpr;
        case TokenKind::SUntilKeyword: return SyntaxKind::SUntilPropertyExpr;
        case TokenKind::UntilWithKeyword: return SyntaxKind::UntilWithPropertyExpr;
        case TokenKind::SUntilWithKeyword: return SyntaxKind::SUntilWithPropertyExpr;
        case TokenKind::ImpliesKeyword: return SyntaxKind::ImpliesPropertyExpr;
        case TokenKind::OrMinusArrow: return SyntaxKind::ImplicationPropertyExpr;
        case TokenKind::OrEqualsArrow: return SyntaxKind::ImplicationPropertyExpr;
        case TokenKind::HashMinusHash: return SyntaxKind::FollowedByPropertyExpr;
        case TokenKind::HashEqualsHash: return SyntaxKind::FollowedByPropertyExpr;
        default: return SyntaxKind::Unknown;
    }
}